

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehavior
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,void *v,void *v_min,void *v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  undefined4 in_EDX;
  float in_stack_0000006c;
  float in_stack_00000078;
  float in_stack_0000007c;
  ImRect *in_stack_00000080;
  ImGuiDataType in_stack_00000088;
  ImGuiID in_stack_0000008c;
  ImRect *in_stack_00000090;
  ImGuiSliderFlags in_stack_00000098;
  float in_stack_0000009c;
  ImGuiSliderFlags in_stack_000000a0;
  float in_stack_000000a4;
  undefined4 in_stack_000000a8;
  float in_stack_000000ac;
  longlong *in_stack_000000b0;
  ImGuiDataType in_stack_000000b8;
  ImGuiID in_stack_000000bc;
  ImRect *in_stack_000000c0;
  ImGuiDataType in_stack_000000c8;
  ImGuiID in_stack_000000cc;
  ImRect *in_stack_000000d0;
  ImGuiSliderFlags in_stack_000000d8;
  ImRect *in_stack_000000e0;
  ImGuiSliderFlags in_stack_000000e8;
  ImRect *in_stack_000000f0;
  bool local_1;
  
  switch(in_EDX) {
  case 0:
    local_1 = SliderBehaviorT<int,int,float>
                        (in_stack_00000080,(ImGuiID)in_stack_0000007c,
                         (ImGuiDataType)in_stack_00000078,(int *)out_grab_bb,(int)in_stack_0000006c,
                         flags,(char *)in_stack_00000090,format._4_4_,in_stack_00000098,
                         (ImRect *)CONCAT44(in_stack_000000a4,in_stack_000000a0));
    break;
  case 1:
    local_1 = SliderBehaviorT<unsigned_int,int,float>
                        (in_stack_00000080,(ImGuiID)in_stack_0000007c,
                         (ImGuiDataType)in_stack_00000078,(uint *)out_grab_bb,
                         (uint)in_stack_0000006c,flags,(char *)in_stack_00000090,format._4_4_,
                         in_stack_00000098,(ImRect *)CONCAT44(in_stack_000000a4,in_stack_000000a0));
    break;
  case 2:
    local_1 = SliderBehaviorT<long_long,long_long,double>
                        (in_stack_000000c0,in_stack_000000bc,in_stack_000000b8,in_stack_000000b0,
                         CONCAT44(in_stack_000000ac,in_stack_000000a8),
                         CONCAT44(in_stack_000000a4,in_stack_000000a0),(char *)in_stack_000000d0,
                         in_stack_0000009c,in_stack_000000d8,in_stack_000000e0);
    break;
  case 3:
    local_1 = SliderBehaviorT<unsigned_long_long,long_long,double>
                        (in_stack_000000d0,in_stack_000000cc,in_stack_000000c8,
                         (unsigned_long_long *)in_stack_000000c0,
                         CONCAT44(in_stack_000000bc,in_stack_000000b8),
                         (unsigned_long_long)in_stack_000000b0,(char *)in_stack_000000e0,
                         in_stack_000000ac,in_stack_000000e8,in_stack_000000f0);
    break;
  case 4:
    local_1 = SliderBehaviorT<float,float,float>
                        (in_stack_00000090,in_stack_0000008c,in_stack_00000088,
                         (float *)in_stack_00000080,in_stack_0000007c,in_stack_00000078,
                         (char *)out_grab_bb,in_stack_0000006c,flags,
                         (ImRect *)CONCAT44(in_stack_000000a4,in_stack_000000a0));
    break;
  case 5:
    local_1 = SliderBehaviorT<double,double,double>
                        (in_stack_000000d0,in_stack_000000cc,in_stack_000000c8,
                         (double *)in_stack_000000c0,
                         (double)CONCAT44(in_stack_000000bc,in_stack_000000b8),
                         (double)in_stack_000000b0,
                         (char *)CONCAT44(in_stack_000000ac,in_stack_000000a8),in_stack_000000a4,
                         in_stack_000000a0,in_stack_000000e0);
    break;
  case 6:
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::SliderBehavior(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, void* v, const void* v_min, const void* v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    switch (data_type)
    {
    case ImGuiDataType_S32:
        IM_ASSERT(*(const ImS32*)v_min >= IM_S32_MIN/2 && *(const ImS32*)v_max <= IM_S32_MAX/2);
        return SliderBehaviorT<ImS32, ImS32, float >(bb, id, data_type, (ImS32*)v,  *(const ImS32*)v_min,  *(const ImS32*)v_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_U32:
        IM_ASSERT(*(const ImU32*)v_min <= IM_U32_MAX/2);
        return SliderBehaviorT<ImU32, ImS32, float >(bb, id, data_type, (ImU32*)v,  *(const ImU32*)v_min,  *(const ImU32*)v_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_S64:
        IM_ASSERT(*(const ImS64*)v_min >= IM_S64_MIN/2 && *(const ImS64*)v_max <= IM_S64_MAX/2);
        return SliderBehaviorT<ImS64, ImS64, double>(bb, id, data_type, (ImS64*)v,  *(const ImS64*)v_min,  *(const ImS64*)v_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_U64:
        IM_ASSERT(*(const ImU64*)v_min <= IM_U64_MAX/2);
        return SliderBehaviorT<ImU64, ImS64, double>(bb, id, data_type, (ImU64*)v,  *(const ImU64*)v_min,  *(const ImU64*)v_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_Float:
        IM_ASSERT(*(const float*)v_min >= -FLT_MAX/2.0f && *(const float*)v_max <= FLT_MAX/2.0f);
        return SliderBehaviorT<float, float, float >(bb, id, data_type, (float*)v,  *(const float*)v_min,  *(const float*)v_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_Double:
        IM_ASSERT(*(const double*)v_min >= -DBL_MAX/2.0f && *(const double*)v_max <= DBL_MAX/2.0f);
        return SliderBehaviorT<double,double,double>(bb, id, data_type, (double*)v, *(const double*)v_min, *(const double*)v_max, format, power, flags, out_grab_bb);
    case ImGuiDataType_COUNT: break;
    }
    IM_ASSERT(0);
    return false;
}